

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolBuilders.cpp
# Opt level: O0

MethodBuilder * __thiscall
slang::ast::ClassBuilder::addMethod
          (ClassBuilder *this,string_view name,Type *retType,SubroutineKind kind)

{
  string_view name_00;
  MethodBuilder *in_RCX;
  Compilation *in_RDX;
  MethodBuilder *in_RDI;
  undefined4 in_R9D;
  MethodBuilder *method;
  Symbol *in_stack_ffffffffffffff88;
  SubroutineKind in_stack_ffffffffffffffac;
  Type *in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffc8 [11];
  
  name_00._M_str._3_1_ = 0;
  name_00._0_11_ = in_stack_ffffffffffffffc8;
  name_00._M_str._4_4_ = in_R9D;
  MethodBuilder::MethodBuilder
            (in_RCX,in_RDX,name_00,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  Scope::addMember((Scope *)in_RDI,in_stack_ffffffffffffff88);
  return in_RDI;
}

Assistant:

MethodBuilder ClassBuilder::addMethod(std::string_view name, const Type& retType,
                                      SubroutineKind kind) {
    MethodBuilder method(compilation, name, retType, kind);
    type.addMember(method.symbol);
    return method;
}